

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void http_rd_start(nni_http_conn *conn)

{
  size_t count;
  nng_err local_1c;
  nni_aio *pnStack_18;
  int rv;
  nni_aio *aio;
  nni_http_conn *conn_local;
  
  while( true ) {
    while( true ) {
      pnStack_18 = conn->rd_uaio;
      if (pnStack_18 == (nni_aio *)0x0) {
        pnStack_18 = (nni_aio *)nni_list_first(&conn->rdq);
        if (pnStack_18 == (nni_aio *)0x0) {
          return;
        }
        nni_list_remove(&conn->rdq,pnStack_18);
        conn->rd_uaio = pnStack_18;
      }
      if ((conn->closed & 1U) == 0) {
        local_1c = http_rd_buf(conn,pnStack_18);
      }
      else {
        local_1c = NNG_ECLOSED;
      }
      if (local_1c != NNG_OK) break;
      conn->rd_uaio = (nni_aio *)0x0;
      count = nni_aio_count(pnStack_18);
      nni_aio_finish(pnStack_18,NNG_OK,count);
    }
    if (local_1c == NNG_EAGAIN) break;
    conn->rd_uaio = (nni_aio *)0x0;
    nni_aio_finish_error(pnStack_18,local_1c);
    http_close(conn);
  }
  return;
}

Assistant:

static void
http_rd_start(nni_http_conn *conn)
{
	for (;;) {
		nni_aio *aio;
		int      rv;

		if ((aio = conn->rd_uaio) == NULL) {
			if ((aio = nni_list_first(&conn->rdq)) == NULL) {
				// No more stuff waiting for read.
				return;
			}
			nni_list_remove(&conn->rdq, aio);
			conn->rd_uaio = aio;
		}

		if (conn->closed) {
			rv = NNG_ECLOSED;
		} else {
			rv = http_rd_buf(conn, aio);
		}
		switch (rv) {
		case NNG_EAGAIN:
			return;
		case 0:
			conn->rd_uaio = NULL;
			nni_aio_finish(aio, NNG_OK, nni_aio_count(aio));
			break;
		default:
			conn->rd_uaio = NULL;
			nni_aio_finish_error(aio, rv);
			http_close(conn);
			break;
		}
	}
}